

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Response::set_content_provider
          (Response *this,string *content_type,ContentProviderWithoutLength *provider,
          ContentProviderResourceReleaser *resource_releaser)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"Content-Type",&local_41);
  set_header(this,&local_40,content_type);
  std::__cxx11::string::~string((string *)&local_40);
  this->content_length_ = 0;
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::function
            ((function<bool_(unsigned_long,_httplib::DataSink_&)> *)&local_40,provider);
  std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::operator=
            ((function<bool(unsigned_long,unsigned_long,httplib::DataSink&)> *)
             &this->content_provider_,(ContentProviderAdapter *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::function<void_(bool)>::operator=
            (&this->content_provider_resource_releaser_,resource_releaser);
  this->is_chunked_content_provider_ = false;
  return;
}

Assistant:

inline void Response::set_content_provider(
    const std::string &content_type, ContentProviderWithoutLength provider,
    ContentProviderResourceReleaser resource_releaser) {
  set_header("Content-Type", content_type);
  content_length_ = 0;
  content_provider_ = detail::ContentProviderAdapter(std::move(provider));
  content_provider_resource_releaser_ = resource_releaser;
  is_chunked_content_provider_ = false;
}